

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetXcFrameworkFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *lang,string *config,
          cmGeneratorTarget *target)

{
  string_view source;
  cmValue cVar1;
  bool bVar2;
  cmLocalGenerator *this_00;
  cmComputeLinkInformation *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  string *psVar3;
  string local_f8;
  string *local_d8;
  string *path;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths;
  cmComputeLinkInformation *cli;
  string local_a0;
  cmValue local_80;
  cmValue sysIncludeSearchFlag;
  string local_68;
  cmValue local_48;
  cmValue includeSearchFlag;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  cmGeneratorTarget *target_local;
  string *config_local;
  string *lang_local;
  cmLocalGenerator *this_local;
  string *flags;
  
  this_00 = cmGeneratorTarget::GetLocalGenerator(target);
  includeSearchFlag.Value = (string *)GetMakefile(this_00);
  bVar2 = cmGeneratorTarget::IsApple(target);
  cVar1.Value = includeSearchFlag.Value;
  if (bVar2) {
    cmStrCat<char_const(&)[20],std::__cxx11::string_const&>
              (&local_68,(char (*) [20])"CMAKE_INCLUDE_FLAG_",lang);
    local_48 = cmMakefile::GetDefinition(cVar1.Value,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    cVar1 = includeSearchFlag;
    cmStrCat<char_const(&)[27],std::__cxx11::string_const&>(&local_a0,(char (*) [27])0xfe83ab,lang);
    local_80 = cmMakefile::GetDefinition(cVar1.Value,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    bVar2 = cmValue::operator_cast_to_bool(&local_48);
    if ((bVar2) || (bVar2 = cmValue::operator_cast_to_bool(&local_80), bVar2)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      this_01 = cmGeneratorTarget::GetLinkInformation(target,config);
      if (this_01 != (cmComputeLinkInformation *)0x0) {
        this_02 = cmComputeLinkInformation::GetXcFrameworkHeaderPaths_abi_cxx11_(this_01);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this_02);
        path = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_02);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&path), bVar2) {
          local_d8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end2);
          bVar2 = cmValue::operator_cast_to_bool(&local_80);
          if ((bVar2) &&
             (bVar2 = cmGeneratorTarget::IsSystemIncludeDirectory(target,local_d8,config,lang),
             bVar2)) {
            psVar3 = cmValue::operator*[abi_cxx11_(&local_80);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
          }
          else {
            psVar3 = cmValue::operator*[abi_cxx11_(&local_48);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
          }
          source = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_f8,&this_00->super_cmOutputConverter,source,SHELL,false);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetXcFrameworkFlags(std::string const& lang,
                                                  std::string const& config,
                                                  cmGeneratorTarget* target)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();
  cmMakefile* mf = lg->GetMakefile();

  if (!target->IsApple()) {
    return std::string();
  }

  cmValue includeSearchFlag =
    mf->GetDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  cmValue sysIncludeSearchFlag =
    mf->GetDefinition(cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));

  if (!includeSearchFlag && !sysIncludeSearchFlag) {
    return std::string{};
  }

  std::string flags;
  if (cmComputeLinkInformation* cli = target->GetLinkInformation(config)) {
    std::vector<std::string> const& paths = cli->GetXcFrameworkHeaderPaths();
    for (std::string const& path : paths) {
      if (sysIncludeSearchFlag &&
          target->IsSystemIncludeDirectory(path, config, lang)) {
        flags += *sysIncludeSearchFlag;
      } else {
        flags += *includeSearchFlag;
      }
      flags += lg->ConvertToOutputFormat(path, cmOutputConverter::SHELL);
      flags += " ";
    }
  }
  return flags;
}